

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrate_x_sq.cc
# Opt level: O3

int main(void)

{
  long lVar1;
  int iVar2;
  ostream *poVar3;
  double dVar4;
  char local_11;
  double local_10;
  
  iVar2 = rand();
  dVar4 = (double)iVar2 * 4.656612873077393e-10;
  local_10 = 0.0;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    dVar4 = pow(dVar4,0.3333333333333333);
    dVar4 = dVar4 * 8.0;
    local_10 = (dVar4 * dVar4) / (dVar4 * 0.375 * dVar4) + 0.0;
  }
  lVar1 = std::cout;
  *(uint *)(std::ostream::operator<< + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ostream::operator<< + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(std::ios_base::Init::Init + *(long *)(lVar1 + -0x18)) = 0xc;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"I = ",4);
  poVar3 = std::ostream::_M_insert<double>(local_10);
  local_11 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_11,1);
  return 0;
}

Assistant:

int main() {
    int N = 1;
    auto sum = 0.0;

    for (int i = 0; i < N; i++) {
        auto z = random_double();
        if (z == 0.0)  // Ignore zero to avoid NaNs
            continue;

        auto x = icd(z);
        sum += x*x / pdf(x);
    }

    std::cout << std::fixed << std::setprecision(12);
    std::cout << "I = " << (sum / N) << '\n';
}